

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task1-5.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  ostream *poVar4;
  istream *piVar5;
  double *pdVar6;
  double x0;
  int w;
  double q2;
  int x;
  int q;
  double t0;
  double v0;
  double w2;
  char local_70;
  undefined7 uStack_6f;
  int local_64;
  double local_60;
  int local_54;
  int local_50;
  int local_4c;
  double local_48;
  double local_40;
  double local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_907,0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_92a,0x36);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,6);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_940,0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,3);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  poVar4 = (ostream *)std::ostream::flush();
  plVar3 = (long *)std::ostream::operator<<(poVar4,3);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  poVar4 = std::ostream::_M_insert<double>(3.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  poVar4 = std::ostream::_M_insert<double>(3.14);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_94a,0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  piVar5 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_4c);
  pdVar6 = (double *)std::istream::operator>>(piVar5,&local_64);
  piVar5 = std::istream::_M_extract<double>(pdVar6);
  std::istream::_M_extract<double>((double *)piVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"int; int  ",10);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_64 + local_4c);
  local_70 = ' ';
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_70,1);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_4c - local_64);
  local_70 = ' ';
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_70,1);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_64 * local_4c);
  local_70 = ' ';
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_70,1);
  plVar3 = (long *)std::ostream::operator<<(poVar4,local_4c / local_64);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"double; double  ",0x10);
  poVar4 = std::ostream::_M_insert<double>(local_60 + local_38);
  local_70 = ' ';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_70,1);
  poVar4 = std::ostream::_M_insert<double>(local_60 - local_38);
  local_70 = ' ';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_70,1);
  poVar4 = std::ostream::_M_insert<double>(local_60 * local_38);
  local_70 = ' ';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_70,1);
  poVar4 = std::ostream::_M_insert<double>(local_60 / local_38);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"int; double  ",0xd);
  poVar4 = std::ostream::_M_insert<double>((double)local_4c + local_38);
  local_70 = ' ';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_70,1);
  poVar4 = std::ostream::_M_insert<double>((double)local_4c - local_38);
  local_70 = ' ';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_70,1);
  poVar4 = std::ostream::_M_insert<double>((double)local_4c * local_38);
  local_70 = ' ';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_70,1);
  poVar4 = std::ostream::_M_insert<double>((double)local_4c / local_38);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"double; int  ",0xd);
  poVar4 = std::ostream::_M_insert<double>((double)local_64 + local_60);
  local_70 = ' ';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_70,1);
  poVar4 = std::ostream::_M_insert<double>(local_60 - (double)local_64);
  local_70 = ' ';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_70,1);
  poVar4 = std::ostream::_M_insert<double>((double)local_64 * local_60);
  local_70 = ' ';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_70,1);
  poVar4 = std::ostream::_M_insert<double>(local_60 / (double)local_64);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_9a0,0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  piVar5 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_50);
  std::istream::operator>>(piVar5,&local_54);
  local_54 = local_50;
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_50);
  local_70 = ' ';
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_70,1);
  plVar3 = (long *)std::ostream::operator<<(poVar4,local_54);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  iVar2 = local_50;
  iVar1 = local_54;
  local_50 = local_54;
  local_54 = iVar2;
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  local_70 = ' ';
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_70,1);
  plVar3 = (long *)std::ostream::operator<<(poVar4,local_54);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_9b6,0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  piVar5 = std::istream::_M_extract<double>((double *)&std::cin);
  piVar5 = std::istream::_M_extract<double>((double *)piVar5);
  std::istream::_M_extract<double>((double *)piVar5);
  poVar4 = std::ostream::_M_insert<double>
                     (local_48 * -9.8 * local_48 * 0.5 +
                      local_40 * local_48 + (double)CONCAT71(uStack_6f,local_70));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return 0;
}

Assistant:

int
main (void)
{
    // первая задача
    cout << "Первая задача" << endl;
    cout << "Реезультат вычисления 2 + 2 * 2 = " << 2 + 2 * 2 << endl;

    // вторая задача
    cout << "Вторая задача" << endl;
    int a = 3, b = 3.999;

    double a2 = 3, b2 = 3.14;

    cout << a << endl << b << endl << a2 << endl << b2 << endl;

    // третья задача
    cout << "Третья задача" << endl;
    int q,w;
    double q2, w2;
    cin >> q >> w >> q2 >> w2;
    cout << "int; int  " << q + w << ' ' << q - w << ' ' << q*w << ' '  << q/w << endl;
    cout << "double; double  " << q2 + w2 << ' ' << q2 - w2 << ' ' << q2*w2 << ' ' << q2/w2 << endl;
    cout << "int; double  " << q + w2 << ' ' << q - w2 << ' ' << q*w2 << ' ' << q/w2 << endl;
    cout << "double; int  "<< q2 + w << ' ' << q2 - w << ' ' << q2*w << ' ' << q2/w << endl;

    // четвертая задача
    cout << "Четвертая задача" << endl;
    int z,x, temp;
    cin >> z >> x;
    x = z;
    z = x;

    cout << z << ' ' << x << endl;
    x = z -x;
    z = z -x;
    x = z + x;

    cout << z << ' ' << x << endl;

    // пятая задача
    cout << "Пятая задача" << endl;
    const double g = -9.8;
    double x0, v0, t0;
    cin >> x0 >> v0 >> t0;
    cout <<x0 + v0*t0 + g*t0*t0/2 << endl;

    return 0;
}